

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O0

void __thiscall ForkNode::ForkNode(ForkNode *this,Instruction *instruction,CallInst *callInst)

{
  undefined8 in_RDX;
  Node *in_RSI;
  Instruction *in_RDI;
  CallInst *in_stack_ffffffffffffffd8;
  
  Node::Node(in_RSI,(NodeType)((ulong)in_RDX >> 0x20),in_RDI,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__ForkNode_001cdac8;
  std::set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>::set
            ((set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *)0x189270);
  std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::set
            ((set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *)0x189281);
  return;
}

Assistant:

ForkNode::ForkNode(const llvm::Instruction *instruction,
                   const llvm::CallInst *callInst)
        : Node(NodeType::FORK, instruction, callInst) {}